

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

size_t Base64ToByteStream(char *InBuffer,size_t InCount,uint8_t *OutBuffer,size_t len)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong in_RCX;
  byte *pbVar4;
  byte *in_RDX;
  byte *pbVar5;
  ulong in_RSI;
  byte *in_RDI;
  uint8_t *endOfOutBuffer;
  size_t outCount;
  int m;
  int n;
  int i;
  uchar acc_2;
  uchar acc_1;
  uchar *pd;
  uchar *ps;
  ulong local_50;
  int local_40;
  byte *local_38;
  byte *local_30;
  size_t local_8;
  
  if (isFirstTime != 0) {
    iT64Build();
  }
  iVar3 = (int)(in_RSI >> 2);
  if ((in_RSI == 0) || ((in_RSI & 3) != 0)) {
    local_8 = 0;
  }
  else {
    local_50 = (ulong)(iVar3 * 3);
    local_30 = in_RDI + in_RSI;
    while (local_30 = local_30 + -1, (uint)*local_30 == (int)P64) {
      local_50 = local_50 - 1;
    }
    if (in_RCX < local_50) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      local_38 = in_RDX;
      local_30 = in_RDI;
      for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
        bVar1 = iT64[local_30[1]];
        *local_38 = iT64[*local_30] << 2 | (byte)((int)(uint)bVar1 >> 4);
        if (in_RDX + local_50 <= local_38 + 1) break;
        pbVar4 = local_30 + 3;
        bVar2 = iT64[local_30[2]];
        pbVar5 = local_38 + 2;
        local_38[1] = bVar1 << 4 | (byte)((int)(uint)bVar2 >> 2);
        if (in_RDX + local_50 <= pbVar5) break;
        local_30 = local_30 + 4;
        local_38 = local_38 + 3;
        *pbVar5 = iT64[*pbVar4] | bVar2 << 6;
      }
      local_8 = local_50;
    }
  }
  return local_8;
}

Assistant:

size_t                              /* Number of output bytes */
	Base64ToByteStream (
		      const char * InBuffer,           /* BASE64 encoded buffer */
		      size_t    InCount,          /* Number of input bytes */
		      uint8_t  * OutBuffer,	/* output buffer length */
		  size_t len         	/* length of output buffer */
	)
	{
		unsigned char * ps;
		unsigned char * pd;
		unsigned char   acc_1;
		unsigned char   acc_2;
		int             i;
		int             n;
		int             m;
		size_t outCount;

		if (isFirstTime) iT64Build();
		n = InCount/4;
		m = InCount%4;
		if (InCount && !m)
		     outCount = 3*n;
		else {
		     outCount = 0;
		     return 0;
		}

		ps = (unsigned char *)(InBuffer + InCount - 1);
		while ( *ps-- == P64 ) outCount--;
		ps = (unsigned char *)InBuffer;

		if (outCount > len) return -1;
		pd = OutBuffer;
		uint8_t * endOfOutBuffer = OutBuffer + outCount;
		for ( i = 0; i < n; i++ ){
		     acc_1 = iT64[*ps++];
		     acc_2 = iT64[*ps++];
		     acc_1 <<= 2;
		     acc_1 |= acc_2>>4;
		     *pd++  = acc_1;
			 if (pd >= endOfOutBuffer) break;

		     acc_2 <<= 4;
		     acc_1 = iT64[*ps++];
		     acc_2 |= acc_1 >> 2;
		     *pd++ = acc_2;
			  if (pd >= endOfOutBuffer) break;

		     acc_2 = iT64[*ps++];
		     acc_2 |= acc_1 << 6;
		     *pd++ = acc_2;
		}

		return outCount;
	}